

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::RegisterConstant
          (ConstantManager *this,
          unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
          *cst)

{
  pair<std::__detail::_Node_iterator<const_spvtools::opt::analysis::Constant_*,_true,_true>,_bool>
  pVar1;
  __node_gen_type __node_gen;
  
  pVar1 = std::
          _Hashtable<spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>,std::__detail::_Identity,spvtools::opt::analysis::ConstantEqual,spvtools::opt::analysis::ConstantHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<spvtools::opt::analysis::Constant_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::analysis::Constant_const*,true>>>>
                    ();
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::
    vector<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>
              ((vector<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>>
                *)&this->owned_constants_,cst);
  }
  return *(Constant **)
          ((long)pVar1.first.
                 super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>._M_cur.
                 super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true> + 8);
}

Assistant:

const Constant* RegisterConstant(std::unique_ptr<Constant> cst) {
    auto ret = const_pool_.insert(cst.get());
    if (ret.second) {
      owned_constants_.emplace_back(std::move(cst));
    }
    return *ret.first;
  }